

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,string *s,bool raw)

{
  value_type vVar1;
  size_type __n;
  ulong uVar2;
  value_type *pvVar3;
  reference pvVar4;
  ulong local_38;
  size_t i;
  allocator<unsigned_char> local_1a;
  undefined1 local_19;
  string *psStack_18;
  bool raw_local;
  string *s_local;
  FBXExportProperty *this_local;
  
  this->type = raw ^ 0x53;
  local_19 = raw;
  psStack_18 = s;
  s_local = (string *)this;
  __n = std::__cxx11::string::size();
  std::allocator<unsigned_char>::allocator(&local_1a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,__n,&local_1a);
  std::allocator<unsigned_char>::~allocator(&local_1a);
  local_38 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= local_38) break;
    pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)psStack_18);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->data,local_38);
    *pvVar4 = vVar1;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::string& s, bool raw)
: type(raw ? 'R' : 'S')
, data(s.size()) {
    for (size_t i = 0; i < s.size(); ++i) {
        data[i] = uint8_t(s[i]);
    }
}